

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_StatusCode UInt64_encodeBinary(UA_UInt64 *src,UA_DataType *_)

{
  UA_StatusCode UVar1;
  
  UVar1 = 0x80080000;
  if (pos + 8 <= end) {
    *(UA_UInt64 *)pos = *src;
    pos = pos + 8;
    UVar1 = 0;
  }
  return UVar1;
}

Assistant:

static UA_StatusCode
UInt64_encodeBinary(UA_UInt64 const *src, const UA_DataType *_) {
    if(pos + sizeof(UA_UInt64) > end)
        return UA_STATUSCODE_BADENCODINGLIMITSEXCEEDED;
#if UA_BINARY_OVERLAYABLE_INTEGER
    memcpy(pos, src, sizeof(UA_UInt64));
#else
    UA_encode64(*src, pos);
#endif
    pos += 8;
    return UA_STATUSCODE_GOOD;
}